

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

bool __thiscall despot::Pocman::SmellFood(Pocman *this,PocmanState *pocstate)

{
  bool bVar1;
  const_reference cVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  
  despot::Coord::Coord((Coord *)&local_44);
  local_44 = -this->smell_range_;
  iVar3 = this->smell_range_;
  while( true ) {
    local_3c = local_44;
    if (iVar3 < local_44) break;
    iVar4 = iVar3;
    for (local_40 = -iVar3; local_40 <= iVar4; local_40 = local_40 + 1) {
      local_38 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_44);
      bVar1 = Grid<int>::Inside(&this->maze_,(Coord *)&local_38);
      if (bVar1) {
        uVar5 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_44);
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&pocstate->food,
                           (long)((int)((ulong)uVar5 >> 0x20) * (this->maze_).xsize_ + (int)uVar5));
        if (cVar2) goto LAB_0010b6f3;
      }
      iVar4 = this->smell_range_;
    }
    local_44 = local_44 + 1;
    iVar3 = iVar4;
  }
LAB_0010b6f3:
  return local_3c <= iVar3;
}

Assistant:

bool Pocman::SmellFood(const PocmanState& pocstate) const {
	Coord smellPos;
	for (smellPos.x = -smell_range_; smellPos.x <= smell_range_; smellPos.x++)
		for (smellPos.y = -smell_range_; smellPos.y <= smell_range_; smellPos.y++)
			if (maze_.Inside(pocstate.pocman_pos + smellPos)
				&& pocstate.food[maze_.Index(pocstate.pocman_pos + smellPos)])
				return true;
	return false;
}